

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O0

EndpointDetails * __thiscall
soul::PoolAllocator::allocate<soul::AST::EndpointDetails,soul::EndpointType&>
          (PoolAllocator *this,EndpointType *args)

{
  pool_ref<soul::AST::Expression> *ppVar1;
  void **this_00;
  _lambda_void___1_ local_29;
  EndpointDetails *local_28;
  EndpointDetails *newObject;
  PoolItem *newItem;
  EndpointType *args_local;
  PoolAllocator *this_local;
  
  newItem = (PoolItem *)args;
  args_local = (EndpointType *)this;
  newObject = (EndpointDetails *)allocateSpaceForObject(this,0x38);
  this_00 = (void **)&(newObject->dataTypes).numActive;
  AST::EndpointDetails::EndpointDetails((EndpointDetails *)this_00,(EndpointType)newItem->size);
  local_28 = (EndpointDetails *)this_00;
  ppVar1 = (pool_ref<soul::AST::Expression> *)
           allocate(soul::EndpointType&)::{lambda(void*)#1}::operator_cast_to_function_pointer
                     (&local_29);
  (newObject->dataTypes).items = ppVar1;
  return local_28;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }